

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  Column_settings **ppCVar1;
  undefined8 uVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  reference witness;
  Returned_column *col;
  logic_error *ex_2;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_480;
  assertion_result local_460;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418 [7];
  basic_cstring<const_char> local_3a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]> local_390;
  assertion_result local_370;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>
  local_320;
  reference local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint i;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_2c0;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_2b8;
  const_iterator local_2b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2a8;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_2a0;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_298;
  const_iterator local_290;
  logic_error *ex_1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_208;
  assertion_result local_1e8;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0 [8];
  logic_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_110;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8 [2];
  undefined1 local_88 [8];
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>> *)
             local_88,(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)&m.matrix_.colSettings_,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,
             (Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> *
             )local_88);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::
  remove_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                 *)local_88,2);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::
  remove_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                 *)local_88,4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_a8,0x341,&local_b8);
    Gudhi::persistence_matrix::
    Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::get_column
              ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                *)local_88,2);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c8,0x341,&local_d8);
      boost::test_tools::assertion_result::assertion_result(&local_f0,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_110,plVar4,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_f0,&local_110,&ex,0x341,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_110);
      boost::test_tools::assertion_result::~assertion_result(&local_f0);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_1a0,0x342,&local_1b0);
    Gudhi::persistence_matrix::
    Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::get_column
              ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                *)local_88,4);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1c0,0x342,&local_1d0);
      boost::test_tools::assertion_result::assertion_result(&local_1e8,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_208,plVar4,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_208,&ex_1,0x342,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_208);
      boost::test_tools::assertion_result::~assertion_result(&local_1e8);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ppCVar1 = &m.matrix_.colSettings_;
  local_2a0._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)ppCVar1);
  local_298 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator+(&local_2a0,4);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)&local_290,&local_298);
  local_2a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::erase((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)ppCVar1,local_290);
  ppCVar1 = &m.matrix_.colSettings_;
  local_2c0._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)ppCVar1);
  local_2b8 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator+(&local_2c0,2);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)&local_2b0,&local_2b8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::erase((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *)ppCVar1,local_2b0);
  __range1._4_4_ = 0;
  ppCVar1 = &m.matrix_.colSettings_;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)ppCVar1);
  b = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)ppCVar1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&b), bVar3) {
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    if ((__range1._4_4_ == 2) || (__range1._4_4_ == 4)) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    local_2f0 = witness;
    col = Gudhi::persistence_matrix::
          Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::
          get_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                      *)local_88,__range1._4_4_);
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
              (&local_320,col);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
              (witness,&local_320);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_320)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_338);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::
  insert_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>> *)
             local_88,&local_338,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_338);
  do {
    Gudhi::persistence_matrix::
    Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::get_column
              ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                *)local_88,2);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_348,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_358);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_348,0x34e,&local_358);
      boost::test_tools::assertion_result::assertion_result(&local_370,true);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_390,plVar4,(char (*) [40])"no exceptions thrown by m.get_column(2)");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_370,&local_390,&local_3a0,0x34e,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]>::
      ~lazy_ostream_impl(&local_390);
      boost::test_tools::assertion_result::~assertion_result(&local_370);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_418,0x34f,&local_428);
    Gudhi::persistence_matrix::
    Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::get_column
              ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                *)local_88,4);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_448);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_438,0x34f,&local_448);
      boost::test_tools::assertion_result::assertion_result(&local_460,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_480,plVar4,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_460,&local_480,&ex_2,0x34f,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_480);
      boost::test_tools::assertion_result::~assertion_result(&local_460);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::~Matrix
            ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> *
             )local_88);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}